

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapScriptFunctionInfo
          (SnapObject *snpObject,InflateMap *inflator)

{
  bool bVar1;
  ScriptContext *this;
  SnapScriptFunctionInfo *pSVar2;
  FunctionBody *this_00;
  JavascriptLibrary *pJVar3;
  ScriptFunctionWithInlineCache *ifunc;
  ScriptFunction *func;
  FunctionBody *fbody;
  SnapScriptFunctionInfo *snapFuncInfo;
  ScriptContext *ctx;
  InflateMap *inflator_local;
  SnapObject *snpObject_local;
  
  this = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  pSVar2 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapScriptFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)4>
                     (snpObject);
  this_00 = InflateMap::LookupFunctionBody(inflator,pSVar2->BodyRefId);
  bVar1 = Js::FunctionBody::GetInlineCachesOnFunctionObject(this_00);
  if (bVar1) {
    pJVar3 = Js::ScriptContext::GetLibrary(this);
    ifunc = Js::JavascriptLibrary::CreateScriptFunctionWithInlineCache
                      (pJVar3,(FunctionProxy *)this_00);
    Js::ScriptFunctionWithInlineCache::CreateInlineCache(ifunc);
  }
  else {
    pJVar3 = Js::ScriptContext::GetLibrary(this);
    ifunc = (ScriptFunctionWithInlineCache *)
            Js::JavascriptLibrary::CreateScriptFunction(pJVar3,(FunctionProxy *)this_00);
  }
  return (RecyclableObject *)ifunc;
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapScriptFunctionInfo(const SnapObject* snpObject, InflateMap* inflator)
        {
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);
            SnapScriptFunctionInfo* snapFuncInfo = SnapObjectGetAddtlInfoAs<SnapScriptFunctionInfo*, SnapObjectType::SnapScriptFunctionObject>(snpObject);

            Js::FunctionBody* fbody = inflator->LookupFunctionBody(snapFuncInfo->BodyRefId);

            Js::ScriptFunction* func = nullptr;
            if(!fbody->GetInlineCachesOnFunctionObject())
            {
                func = ctx->GetLibrary()->CreateScriptFunction(fbody);
            }
            else
            {
                Js::ScriptFunctionWithInlineCache* ifunc = ctx->GetLibrary()->CreateScriptFunctionWithInlineCache(fbody);
                ifunc->CreateInlineCache();

                func = ifunc;
            }

            return func;
        }